

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char32_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char32_t> *this)

{
  bool bVar1;
  char32_t delim;
  char32_t *__str;
  char *message;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_R9;
  AssertionHelper local_238;
  Fixed local_1f8;
  char32_t *local_70;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  split_helper<char32_t,_true,_false,_false> local_38;
  split_helper_subroutine<detail::split_at_last_front,_char32_t,_char32_t> local_34;
  undefined1 local_30 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> re;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char32_t> *this_local;
  
  __str = constant::cpp_type_data1<char32_t>();
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view
            ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&re._M_str,__str);
  delim = constant::colon<char32_t>();
  local_38 = split<char32_t,_nullptr>(delim);
  at_last();
  detail::split_at_last::front((split_at_last *)&iutest_ar.field_0x26);
  local_34 = detail::split_helper<char32_t,_true,_false,_false>::
             operator>><detail::split_at_last_front,_nullptr>(&local_38);
  _local_30 = detail::
              operator|<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_char32_t,_char32_t,_nullptr>
                        ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&re._M_str,
                         &local_34);
  iutest::detail::AlwaysZero();
  local_70 = constant::cpp_basic_istream<char32_t>();
  iutest::internal::EqHelper<false>::
  Compare<char32_t_const*,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
            ((AssertionResult *)local_68,
             (EqHelper<false> *)"constant::cpp_basic_istream<char_type>()","re",(char *)&local_70,
             (char32_t **)local_30,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    message = iutest::AssertionResult::message((AssertionResult *)local_68);
    iutest::AssertionHelper::AssertionHelper
              (&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x95,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_238,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_238);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_front_by_single_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::cpp_type_data1<char_type>();
	const auto re = s | split(constant::colon<char_type>()) >> at_last().front();
	IUTEST_ASSERT_EQ(constant::cpp_basic_istream<char_type>(), re);
}